

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O3

void __thiscall MTRand::seed(MTRand *this,uint32 oneSeed)

{
  long lVar1;
  ulong uVar2;
  uint32 *s;
  
  uVar2 = oneSeed & 0xffffffff;
  this->state[0] = uVar2;
  lVar1 = 0;
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar1 + 1);
    this->state[lVar1 + 1] = uVar2;
    lVar1 = lVar1 + 1;
  } while ((int)lVar1 != 0x26f);
  reload(this);
  return;
}

Assistant:

void MTRand::initialize(const uint32 seed) {
  // Initialize generator state with seed
  // See Knuth TAOCP Vol 2, 3rd Ed, p.106 for multiplier.
  // In previous versions, most significant bits (MSBs) of the seed affect
  // only MSBs of the state array.  Modified 9 Jan 2002 by Makoto Matsumoto.
  uint32 *s = state;
  uint32 *r = state;
  int i = 1;
  *s++ = seed & 0xffffffffUL;
  for (; i < N; ++i) {
    *s++ = (1812433253UL * (*r ^ (*r >> 30)) + i) & 0xffffffffUL;
    r++;
  }
}